

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dispatch.cpp
# Opt level: O0

cl_command_buffer_khr
clCreateCommandBufferKHR
          (cl_uint num_queues,cl_command_queue *queues,cl_command_buffer_properties_khr *properties,
          cl_int *errcode_ret)

{
  uint64_t enqueueCounter_00;
  bool bVar1;
  CLIntercept *pCVar2;
  SConfig *pSVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  time_point start;
  cl_command_buffer_khr tag;
  SConfig *pSVar6;
  uint *in_RCX;
  CLIntercept *in_RDX;
  cl_command_queue *in_RSI;
  cl_uint in_EDI;
  cl_command_buffer_khr retVal;
  time_point cpuEnd;
  time_point cpuStart;
  cl_int localErrorCode;
  string propsStr;
  string queueList;
  uint64_t enqueueCounter;
  CLdispatchX *dispatchX;
  cl_command_queue queue;
  CLIntercept *pIntercept;
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  *in_stack_fffffffffffffdc0;
  CLIntercept *in_stack_fffffffffffffdc8;
  CLIntercept *in_stack_fffffffffffffdd0;
  allocator *paVar7;
  CObjectTracker *in_stack_fffffffffffffdd8;
  SConfig *in_stack_fffffffffffffde8;
  CLIntercept *in_stack_fffffffffffffdf0;
  SConfig *in_stack_fffffffffffffe00;
  SConfig *in_stack_fffffffffffffe08;
  CLIntercept *in_stack_fffffffffffffe10;
  SConfig *in_stack_fffffffffffffe50;
  undefined1 includeId;
  SConfig *in_stack_fffffffffffffe68;
  time_point in_stack_fffffffffffffe78;
  time_point in_stack_fffffffffffffe80;
  time_point in_stack_fffffffffffffe88;
  cl_command_queue local_140;
  undefined4 in_stack_fffffffffffffec8;
  int in_stack_fffffffffffffecc;
  _cl_command_queue **in_stack_fffffffffffffed0;
  undefined8 in_stack_fffffffffffffed8;
  cl_uint cVar8;
  CLIntercept *in_stack_fffffffffffffee0;
  string local_118 [32];
  undefined8 local_f8;
  undefined8 local_f0;
  allocator local_e1;
  string local_e0 [24];
  cl_command_buffer_khr p_Var9;
  undefined8 in_stack_ffffffffffffff60;
  uint local_98 [4];
  string local_88 [8];
  string *in_stack_ffffffffffffff80;
  cl_command_buffer_properties_khr *in_stack_ffffffffffffff88;
  CLIntercept *in_stack_ffffffffffffff90;
  string local_68 [32];
  uint64_t local_48;
  CLdispatchX *local_40;
  cl_command_queue local_38;
  CLIntercept *this;
  
  cVar8 = (cl_uint)((ulong)in_stack_fffffffffffffed8 >> 0x20);
  pCVar2 = GetIntercept();
  if (pCVar2 == (CLIntercept *)0x0) {
LAB_00184532:
    std::_Swallow_assign::operator=((_Swallow_assign *)&std::ignore,(int *)&stack0xfffffffffffffecc)
    ;
    if (in_RCX != (uint *)0x0) {
      *in_RCX = 0xffffffe2;
    }
    return (cl_command_buffer_khr)0x0;
  }
  if ((in_EDI == 0) || (in_RSI == (cl_command_queue *)0x0)) {
    local_140 = (cl_command_queue)0x0;
  }
  else {
    local_140 = *in_RSI;
  }
  local_38 = local_140;
  local_40 = CLIntercept::dispatchX
                       (in_stack_fffffffffffffdd0,(cl_command_queue)in_stack_fffffffffffffdc8);
  if (local_40->clCreateCommandBufferKHR ==
      (_func_cl_command_buffer_khr_cl_uint_cl_command_queue_ptr_cl_command_buffer_properties_khr_ptr_cl_int_ptr
       *)0x0) goto LAB_00184532;
  local_48 = CLIntercept::getEnqueueCounter(in_stack_fffffffffffffdc8);
  std::__cxx11::string::string(local_68);
  std::__cxx11::string::string(local_88);
  pSVar3 = CLIntercept::config(pCVar2);
  if ((pSVar3->CallLogging & 1U) != 0) {
    CLIntercept::getObjectListString<_cl_command_queue*>
              (in_stack_fffffffffffffee0,cVar8,in_stack_fffffffffffffed0,
               (string *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
    CLIntercept::getCommandBufferPropertiesString
              (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
  }
  pSVar3 = CLIntercept::config(pCVar2);
  enqueueCounter_00 = local_48;
  this = pCVar2;
  if ((pSVar3->CallLogging & 1U) != 0) {
    uVar4 = std::__cxx11::string::c_str();
    uVar5 = std::__cxx11::string::c_str();
    CLIntercept::callLoggingEnter
              (pCVar2,"clCreateCommandBufferKHR",enqueueCounter_00,(cl_kernel)0x0,
               "queues = %s, properties = [ %s ]",uVar4,uVar5);
  }
  local_98[0] = 0;
  start.__d.__r = (duration)CLIntercept::config(this);
  if ((((((((SConfig *)start.__d.__r)->CallLogging & 1U) != 0) ||
        (in_stack_fffffffffffffe88.__d.__r = (duration)CLIntercept::config(this),
        (((SConfig *)in_stack_fffffffffffffe88.__d.__r)->ErrorLogging & 1U) != 0)) ||
       (in_stack_fffffffffffffe80.__d.__r = (duration)CLIntercept::config(this),
       ((((CLIntercept *)in_stack_fffffffffffffe80.__d.__r)->m_Mutex).super___mutex_base._M_mutex.
        __size[0x14] & 1U) != 0)) ||
      (in_stack_fffffffffffffe78.__d.__r = (duration)CLIntercept::config(this),
      (((SConfig *)in_stack_fffffffffffffe78.__d.__r)->NoErrors & 1U) != 0)) &&
     (in_RCX == (uint *)0x0)) {
    in_RCX = local_98;
  }
  std::chrono::
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  ::time_point(in_stack_fffffffffffffdc0);
  std::chrono::
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  ::time_point(in_stack_fffffffffffffdc0);
  pCVar2 = (CLIntercept *)CLIntercept::config(this);
  if ((((ulong)(pCVar2->m_Dispatch).clCreateContextFromType & 1) != 0) ||
     (in_stack_fffffffffffffe68 = CLIntercept::config(this),
     (in_stack_fffffffffffffe68->ChromeCallLogging & 1U) != 0)) {
    in_stack_ffffffffffffff60 = std::chrono::_V2::steady_clock::now();
  }
  tag = (*local_40->clCreateCommandBufferKHR)(in_EDI,in_RSI,&in_RDX->m_ProcessId,(cl_int *)in_RCX);
  p_Var9 = tag;
  pSVar3 = CLIntercept::config(this);
  if ((pSVar3->HostPerformanceTiming & 1U) == 0) {
    in_stack_fffffffffffffe50 = CLIntercept::config(this);
    includeId = (undefined1)((ulong)pSVar3 >> 0x38);
    if ((in_stack_fffffffffffffe50->ChromeCallLogging & 1U) == 0) goto LAB_0018419a;
  }
  includeId = (undefined1)((ulong)pSVar3 >> 0x38);
  uVar4 = std::chrono::_V2::steady_clock::now();
  pSVar3 = CLIntercept::config(this);
  if (((pSVar3->HostPerformanceTiming & 1U) != 0) &&
     (bVar1 = CLIntercept::checkHostPerformanceTimingEnqueueLimits(this,local_48), bVar1)) {
    std::allocator<char>::allocator();
    local_f8 = uVar4;
    local_f0 = in_stack_ffffffffffffff60;
    std::__cxx11::string::string(local_e0,"",&local_e1);
    CLIntercept::updateHostTimingStats
              ((CLIntercept *)in_stack_fffffffffffffe80.__d.__r,
               (char *)in_stack_fffffffffffffe78.__d.__r,(string *)pCVar2,start,
               in_stack_fffffffffffffe88);
    std::__cxx11::string::~string(local_e0);
    std::allocator<char>::~allocator((allocator<char> *)&local_e1);
  }
LAB_0018419a:
  pSVar3 = CLIntercept::config(this);
  if (((((pSVar3->ErrorLogging & 1U) != 0) ||
       (pSVar3 = CLIntercept::config(this), (pSVar3->ErrorAssert & 1U) != 0)) ||
      (pSVar3 = CLIntercept::config(this), (pSVar3->NoErrors & 1U) != 0)) && (*in_RCX != 0)) {
    in_stack_fffffffffffffe10 = (CLIntercept *)CLIntercept::config(this);
    if (((in_stack_fffffffffffffe10->m_Mutex).super___mutex_base._M_mutex.__size[0x13] & 1U) != 0) {
      CLIntercept::logError(in_RDX,(char *)in_RCX,(cl_int)((ulong)this >> 0x20));
    }
    in_stack_fffffffffffffe08 = CLIntercept::config(this);
    if ((in_stack_fffffffffffffe08->ErrorAssert & 1U) != 0) {
      raise(5);
    }
    in_stack_fffffffffffffe00 = CLIntercept::config(this);
    if ((in_stack_fffffffffffffe00->NoErrors & 1U) != 0) {
      *in_RCX = 0;
    }
  }
  cVar8 = (cl_uint)((ulong)in_stack_fffffffffffffe00 >> 0x20);
  pSVar3 = CLIntercept::config(this);
  if ((pSVar3->LeakChecking & 1U) != 0) {
    in_stack_fffffffffffffdf0 = (CLIntercept *)CLIntercept::objectTracker(this);
    CObjectTracker::AddAllocation<_cl_command_buffer_khr*>
              (in_stack_fffffffffffffdd8,(_cl_command_buffer_khr *)in_stack_fffffffffffffdd0);
  }
  if ((p_Var9 != (cl_command_buffer_khr)0x0) &&
     (in_stack_fffffffffffffde8 = CLIntercept::config(this),
     (in_stack_fffffffffffffde8->DumpCommandBuffers & 1U) != 0)) {
    CLIntercept::recordCommandBufferCreate
              (in_stack_fffffffffffffe10,(cl_command_buffer_khr)in_stack_fffffffffffffe08,cVar8,
               (cl_command_queue *)pSVar3);
  }
  pSVar3 = CLIntercept::config(this);
  if ((pSVar3->CallLogging & 1U) != 0) {
    CLIntercept::callLoggingExit
              (this,"clCreateCommandBufferKHR",(cl_int)(ulong)*in_RCX,(cl_event *)0x0,
               (cl_sync_point_khr *)0x0,"returned %p",p_Var9);
  }
  pSVar6 = CLIntercept::config(this);
  if ((pSVar6->ChromeCallLogging & 1U) != 0) {
    paVar7 = (allocator *)&stack0xfffffffffffffee7;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_118,"",paVar7);
    CLIntercept::chromeCallLoggingExit
              (pCVar2,&in_stack_fffffffffffffe68->SuppressLogging,(string *)tag,(bool)includeId,
               (uint64_t)in_stack_fffffffffffffe50,in_stack_fffffffffffffe80,
               in_stack_fffffffffffffe78);
    std::__cxx11::string::~string(local_118);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffee7);
  }
  if (p_Var9 != (cl_command_buffer_khr)0x0) {
    CLIntercept::addCommandBufferInfo
              (in_stack_fffffffffffffdf0,(cl_command_buffer_khr)in_stack_fffffffffffffde8,
               (cl_command_queue)pSVar3);
  }
  std::__cxx11::string::~string(local_88);
  std::__cxx11::string::~string(local_68);
  return p_Var9;
}

Assistant:

CL_API_ENTRY cl_command_buffer_khr CL_API_CALL clCreateCommandBufferKHR(
    cl_uint num_queues,
    const cl_command_queue* queues,
    const cl_command_buffer_properties_khr* properties,
    cl_int* errcode_ret)
{
    CLIntercept*    pIntercept = GetIntercept();

    if( pIntercept )
    {
        cl_command_queue queue = num_queues && queues ? queues[0] : NULL;
        const auto& dispatchX = pIntercept->dispatchX(queue);
        if( dispatchX.clCreateCommandBufferKHR )
        {
            GET_ENQUEUE_COUNTER();

            std::string queueList;
            std::string propsStr;
            if( pIntercept->config().CallLogging )
            {
                pIntercept->getObjectListString(
                    num_queues,
                    queues,
                    queueList );
                pIntercept->getCommandBufferPropertiesString(
                    properties,
                    propsStr );
            }
            CALL_LOGGING_ENTER( "queues = %s, properties = [ %s ]",
                queueList.c_str(),
                propsStr.c_str() );
            CHECK_ERROR_INIT( errcode_ret );
            HOST_PERFORMANCE_TIMING_START();

            cl_command_buffer_khr   retVal = dispatchX.clCreateCommandBufferKHR(
                num_queues,
                queues,
                properties,
                errcode_ret );

            HOST_PERFORMANCE_TIMING_END();
            CHECK_ERROR( errcode_ret[0] );
            ADD_OBJECT_ALLOCATION( retVal );
            RECORD_COMMAND_BUFFER_CREATE( retVal, num_queues, queues );
            CALL_LOGGING_EXIT( errcode_ret[0], "returned %p", retVal );

            if( retVal != NULL )
            {
                pIntercept->addCommandBufferInfo(
                    retVal,
                    queue );
            }

            return retVal;
        }
    }

    NULL_FUNCTION_POINTER_SET_ERROR_RETURN_NULL(errcode_ret, CL_INVALID_VALUE);
}